

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

string_t * __thiscall
pugi::xml_node::path_abi_cxx11_(string_t *__return_storage_ptr__,xml_node *this,char_t delimiter)

{
  char *__s;
  char_t *__s_00;
  xml_node_struct *pxVar1;
  string_t temp;
  allocator<char> local_51;
  xml_node_struct *local_50 [2];
  uintptr_t local_40;
  
  pxVar1 = this->_root;
  __s = "";
  if (pxVar1 != (xml_node_struct *)0x0) {
    __s = "";
    if (pxVar1->name != (char_t *)0x0) {
      __s = pxVar1->name;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)local_50);
  do {
    if (pxVar1 == (xml_node_struct *)0x0) {
      xml_node((xml_node *)local_50);
      if (local_50[0] == (xml_node_struct *)0x0) {
        return __return_storage_ptr__;
      }
      xml_node((xml_node *)local_50);
    }
    else {
      xml_node((xml_node *)local_50,pxVar1->parent);
      if (local_50[0] == (xml_node_struct *)0x0) {
        return __return_storage_ptr__;
      }
      xml_node((xml_node *)local_50,pxVar1->parent);
    }
    pxVar1 = local_50[0];
    __s_00 = "";
    if ((local_50[0] != (xml_node_struct *)0x0) &&
       (__s_00 = local_50[0]->name, __s_00 == (char_t *)0x0)) {
      __s_00 = "";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s_00,&local_51);
    std::__cxx11::string::push_back((char)(string *)local_50);
    std::__cxx11::string::_M_append
              ((char *)local_50,(ulong)(__return_storage_ptr__->_M_dataplus)._M_p);
    std::__cxx11::string::swap((string *)__return_storage_ptr__);
    if (local_50[0] != (xml_node_struct *)&local_40) {
      operator_delete(local_50[0],local_40 + 1);
    }
  } while( true );
}

Assistant:

PUGI__FN string_t xml_node::path(char_t delimiter) const
	{
		xml_node cursor = *this; // Make a copy.
		
		string_t result = cursor.name();

		while (cursor.parent())
		{
			cursor = cursor.parent();
			
			string_t temp = cursor.name();
			temp += delimiter;
			temp += result;
			result.swap(temp);
		}

		return result;
	}